

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O1

void __thiscall mp::SPAdapter::GetRandomVectors(SPAdapter *this,Problem *p)

{
  double dVar1;
  uint uVar2;
  Impl *pIVar3;
  CallExpr random;
  int *piVar4;
  iterator __position;
  int iVar5;
  Error *pEVar6;
  UnsupportedError *__return_storage_ptr__;
  ulong uVar7;
  ulong uVar8;
  pointer this_00;
  double prob;
  uint local_84;
  ulong local_80;
  SPAdapter *local_78;
  Problem *local_70;
  pointer local_68;
  string local_60;
  vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_> *local_40;
  int local_34;
  
  std::vector<int,_std::allocator<int>_>::resize
            (&this->var_orig2core_,
             (long)(int)((ulong)((long)(p->vars_).
                                       super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(p->vars_).
                                      super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  local_80 = (ulong)((long)(p->logical_cons_).
                           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(p->logical_cons_).
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar5 = (int)local_80;
  if (iVar5 != 0) {
    local_40 = &this->rvs_;
    std::vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>::resize
              (local_40,(long)iVar5);
    if (0 < iVar5) {
      local_80 = (ulong)((uint)local_80 & 0x7fffffff);
      uVar8 = 0;
      local_78 = this;
      local_70 = p;
      do {
        pIVar3 = (p->logical_cons_).
                 super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].super_ExprBase.impl_;
        if (pIVar3->kind_ != LAST_RELATIONAL) {
          __return_storage_ptr__ = (UnsupportedError *)__cxa_allocate_exception(0x18);
          MakeUnsupportedError<>(__return_storage_ptr__,(CStringRef)0x16f2fc);
LAB_001617b4:
          __cxa_throw(__return_storage_ptr__,&UnsupportedError::typeinfo,
                      fmt::SystemError::~SystemError);
        }
        random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_ =
             *(BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41> *)&pIVar3[2].kind_;
        if ((((*(int *)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase
                       .impl_ != 0x29) ||
             (*(Impl **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                               super_ExprBase.impl_ + 8) != (this->random_).impl_)) ||
            (**(int **)(pIVar3 + 4) != 1)) ||
           ((dVar1 = *(double *)(*(int **)(pIVar3 + 4) + 2), dVar1 != 0.0 || (NAN(dVar1))))) {
          __return_storage_ptr__ = (UnsupportedError *)__cxa_allocate_exception(0x18);
          MakeUnsupportedError<>(__return_storage_ptr__,(CStringRef)0x16f2fc);
          goto LAB_001617b4;
        }
        uVar2 = *(uint *)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                super_ExprBase.impl_ + 0x10);
        if ((ulong)uVar2 != 0) {
          iVar5 = (int)uVar8;
          if ((int)uVar2 < 1) {
            uVar7 = 0;
          }
          else {
            this_00 = (local_40->
                      super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar8;
            uVar7 = 0;
            do {
              piVar4 = *(int **)((long)random.
                                       super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                       super_ExprBase.impl_ + 0x18 + uVar7 * 8);
              this = local_78;
              p = local_70;
              if (*piVar4 != 1) goto LAB_0016168d;
              local_68 = *(pointer *)(piVar4 + 2);
              if (((double)local_68 < 0.0) || (1.0 < (double)local_68)) {
                local_84 = (uint)uVar7;
                pEVar6 = (Error *)__cxa_allocate_exception(0x18);
                local_34 = iVar5 + 1;
                fmt::format<int>(&local_60,(CStringRef)0x176b98,&local_34);
                Error::Error<std::__cxx11::string,double>
                          (pEVar6,(CStringRef)0x176b5b,&local_60,(double *)&local_68);
                __cxa_throw(pEVar6,&Error::typeinfo,fmt::SystemError::~SystemError);
              }
              __position._M_current =
                   *(pointer *)
                    ((long)&(this_00->probabilities_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
              local_60._M_dataplus._M_p = local_68;
              if (__position._M_current ==
                  *(pointer *)
                   ((long)&(this_00->probabilities_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10)) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)this_00,__position,
                           (double *)&local_60);
              }
              else {
                *__position._M_current = (double)local_68;
                *(double **)
                 ((long)&(this_00->probabilities_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) =
                     __position._M_current + 1;
              }
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
            uVar7 = (ulong)uVar2;
            this = local_78;
            p = local_70;
          }
LAB_0016168d:
          local_84 = (uint)uVar7;
          while ((int)uVar7 < (int)uVar2) {
            if (**(int **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                 super_ExprBase.impl_ + 0x18 + (long)(int)uVar7 * 8) != 2) {
              pEVar6 = (Error *)__cxa_allocate_exception(0x18);
              local_68 = (pointer)CONCAT44(local_68._4_4_,iVar5 + 1);
              fmt::format<int>(&local_60,(CStringRef)0x176b98,(int *)&local_68);
              Error::Error<std::__cxx11::string>(pEVar6,(CStringRef)0x176b76,&local_60);
              __cxa_throw(pEVar6,&Error::typeinfo,fmt::SystemError::~SystemError);
            }
            GetRealizations(this,iVar5,random,(int *)&local_84);
            uVar7 = (ulong)local_84;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_80);
    }
  }
  return;
}

Assistant:

void SPAdapter::GetRandomVectors(const Problem &p) {
  var_orig2core_.resize(p.num_vars());
  int num_logical_cons = p.num_logical_cons();
  if (num_logical_cons == 0)
    return;
  rvs_.resize(num_logical_cons);
  for (int con_index = 0; con_index < num_logical_cons; ++con_index) {
    auto expr = p.logical_con(con_index).expr();
    if (expr.kind() != expr::NE)
      throw MakeUnsupportedError("logical constraint");
    auto relational = Cast<RelationalExpr>(expr);
    auto call = Cast<CallExpr>(relational.lhs());
    if (!call || call.function() != random_ || !IsZero(relational.rhs()))
      throw MakeUnsupportedError("logical constraint");
    int num_args = call.num_args();
    if (num_args == 0)
      continue;
    auto &rv = rvs_[con_index];
    int arg_index = 0;
    // Get probabilities.
    for (; arg_index < num_args; ++arg_index) {
      auto constant = Cast<NumericConstant>(call.arg(arg_index));
      if (!constant) break;
      double prob = constant.value();
      if (prob < 0 || prob > 1)
        throw Error("{}: invalid probability {}", lcon_name(con_index), prob);
      rv.AddProbability(prob);
    }
    // Get realizations.
    while (arg_index < num_args) {
      auto arg = call.arg(arg_index);
      if (arg.kind() != expr::VARIABLE)
        throw Error("{}: expected variable or constant", lcon_name(con_index));
      GetRealizations(con_index, call, arg_index);
    }
  }
}